

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O0

Vector2i __thiscall sf::priv::WindowImplX11::getPosition(WindowImplX11 *this)

{
  bool bVar1;
  Window WVar2;
  long in_RDI;
  uint depth;
  uint borderWidth;
  uint height;
  uint width;
  int yRelToRoot;
  int xRelToRoot;
  Window root;
  Window ancestor;
  long yFrameExtent;
  long xFrameExtent;
  int yAbsRelToRoot;
  int xAbsRelToRoot;
  Window child;
  Window in_stack_ffffffffffffffa8;
  Display *in_stack_ffffffffffffffb0;
  int local_48;
  int local_44;
  Window local_40;
  Window local_38;
  int local_30;
  int local_28;
  int local_20;
  int local_1c;
  undefined1 local_18 [16];
  Vector2i local_8;
  
  XTranslateCoordinates
            (*(undefined8 *)(in_RDI + 0x3d0),*(undefined8 *)(in_RDI + 0x3c8),
             *(undefined8 *)
              (*(long *)(*(long *)(in_RDI + 0x3d0) + 0xe8) +
               (long)*(int *)(*(long *)(in_RDI + 0x3d0) + 0xe0) * 0x80 + 0x10),0,0,&local_1c,
             &local_20,local_18);
  bVar1 = anon_unknown.dwarf_ccfdb::isWMAbsolutePositionGood();
  if (bVar1) {
    Vector2<int>::Vector2(&local_8,local_1c,local_20);
  }
  else {
    bVar1 = anon_unknown.dwarf_ccfdb::getEWMHFrameExtents
                      (_yAbsRelToRoot,xFrameExtent,(long *)yFrameExtent,(long *)ancestor);
    if (bVar1) {
      Vector2<int>::Vector2(&local_8,local_1c - local_28,local_20 - local_30);
    }
    else {
      local_38 = *(Window *)(in_RDI + 0x3c8);
      local_40 = *(Window *)
                  (*(long *)(*(long *)(in_RDI + 0x3d0) + 0xe8) +
                   (long)*(int *)(*(long *)(in_RDI + 0x3d0) + 0xe0) * 0x80 + 0x10);
      while( true ) {
        WVar2 = anon_unknown.dwarf_ccfdb::getParentWindow
                          (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
        if (WVar2 == local_40) break;
        local_38 = anon_unknown.dwarf_ccfdb::getParentWindow
                             (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      }
      XGetGeometry(*(undefined8 *)(in_RDI + 0x3d0),local_38,&local_40,&local_44,&local_48,
                   &stack0xffffffffffffffb4,&stack0xffffffffffffffb0,&stack0xffffffffffffffac,
                   &stack0xffffffffffffffa8);
      Vector2<int>::Vector2(&local_8,local_44,local_48);
    }
  }
  return local_8;
}

Assistant:

Vector2i WindowImplX11::getPosition() const
{
    // Get absolute position of our window relative to root window. This
    // takes into account all information that X11 has, including X11
    // border widths and any decorations. It corresponds to where the
    // window actually is, but not necessarily to where we told it to
    // go using setPosition() and XMoveWindow(). To have the two match
    // as expected, we may have to subtract decorations and borders.
    ::Window child;
    int xAbsRelToRoot, yAbsRelToRoot;

    XTranslateCoordinates(m_display, m_window, DefaultRootWindow(m_display),
        0, 0, &xAbsRelToRoot, &yAbsRelToRoot, &child);

    // CASE 1: some rare WMs actually put the window exactly where we tell
    // it to, even with decorations and such, which get shifted back.
    // In these rare cases, we can use the absolute value directly.
    if (isWMAbsolutePositionGood())
        return Vector2i(xAbsRelToRoot, yAbsRelToRoot);

    // CASE 2: most modern WMs support EWMH and can define _NET_FRAME_EXTENTS
    // with the exact frame size to subtract, so if present, we prefer it and
    // query it first. According to spec, this already includes any borders.
    long xFrameExtent, yFrameExtent;

    if (getEWMHFrameExtents(m_display, m_window, xFrameExtent, yFrameExtent))
    {
        // Get final X/Y coordinates: subtract EWMH frame extents from
        // absolute window position.
        return Vector2i((xAbsRelToRoot - xFrameExtent), (yAbsRelToRoot - yFrameExtent));
    }

    // CASE 3: EWMH frame extents were not available, use geometry.
    // We climb back up to the window before the root and use its
    // geometry information to extract X/Y position. This because
    // re-parenting WMs may re-parent the window multiple times, so
    // we'd have to climb up to the furthest ancestor and sum the
    // relative differences and borders anyway; and doing that to
    // subtract those values from the absolute coordinates of the
    // window is equivalent to going up the tree and asking the
    // furthest ancestor what it's relative distance to the root is.
    // So we use that approach because it's simpler.
    // This approach assumes that any window between the root and
    // our window is part of decorations/borders in some way. This
    // seems to hold true for most reasonable WM implementations.
    ::Window ancestor = m_window;
    ::Window root = DefaultRootWindow(m_display);

    while (getParentWindow(m_display, ancestor) != root)
    {
        // Next window up (parent window).
        ancestor = getParentWindow(m_display, ancestor);
    }

    // Get final X/Y coordinates: take the relative position to
    // the root of the furthest ancestor window.
    int xRelToRoot, yRelToRoot;
    unsigned int width, height, borderWidth, depth;

    XGetGeometry(m_display, ancestor, &root, &xRelToRoot, &yRelToRoot,
        &width, &height, &borderWidth, &depth);

    return Vector2i(xRelToRoot, yRelToRoot);
}